

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3rbu_destroy_vfs(char *zName)

{
  sqlite3_vfs *pVfs;
  
  pVfs = sqlite3_vfs_find(zName);
  if ((pVfs != (sqlite3_vfs *)0x0) && (pVfs->xOpen == rbuVfsOpen)) {
    if (*(sqlite3_mutex **)&pVfs[1].mxPathname != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexFree)(*(sqlite3_mutex **)&pVfs[1].mxPathname);
    }
    sqlite3_vfs_unregister(pVfs);
    sqlite3_free(pVfs);
    return;
  }
  return;
}

Assistant:

SQLITE_API void sqlite3rbu_destroy_vfs(const char *zName){
  sqlite3_vfs *pVfs = sqlite3_vfs_find(zName);
  if( pVfs && pVfs->xOpen==rbuVfsOpen ){
    sqlite3_mutex_free(((rbu_vfs*)pVfs)->mutex);
    sqlite3_vfs_unregister(pVfs);
    sqlite3_free(pVfs);
  }
}